

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> * __thiscall
unodb::detail::copy_atomic_to_nonatomic<std::array<std::atomic<unsigned_long>,4ul>const>
          (non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_>
           *__return_storage_ptr__,detail *this,array<std::atomic<unsigned_long>,_4UL> *atomic_array
          )

{
  __int_type _Var1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_30;
  size_type i;
  array<std::atomic<unsigned_long>,_4UL> *atomic_array_local;
  memory_order __b;
  
  for (local_30 = 0; sVar2 = std::array<unsigned_long,_4UL>::size(__return_storage_ptr__),
      local_30 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = std::array<std::atomic<unsigned_long>,_4UL>::operator[]
                       ((array<std::atomic<unsigned_long>,_4UL> *)this,local_30);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    _Var1 = (pvVar3->super___atomic_base<unsigned_long>)._M_i;
    pvVar4 = std::array<unsigned_long,_4UL>::operator[](__return_storage_ptr__,local_30);
    *pvVar4 = _Var1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline non_atomic_array<T> copy_atomic_to_nonatomic(T& atomic_array) noexcept {
  UNODB_DETAIL_DISABLE_MSVC_WARNING(26494)
  non_atomic_array<T> result;
  UNODB_DETAIL_RESTORE_MSVC_WARNINGS()

  for (typename decltype(result)::size_type i = 0; i < result.size(); ++i) {
    result[i] = atomic_array[i].load(std::memory_order_relaxed);
  }
  return result;
}